

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

void __thiscall
DataFilters::StringFilter::StringFilter
          (StringFilter *this,string *pattern,bool *isExact,bool *isSensitive,bool *isAccept)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  size_type sVar4;
  
  (this->_pattern)._M_dataplus._M_p = (pointer)&(this->_pattern).field_2;
  pcVar1 = (pattern->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + pattern->_M_string_length);
  this->_isExact = *isExact;
  this->_isSensitive = *isSensitive;
  this->_isAccept = *isAccept;
  if ((*isSensitive == false) && (sVar2 = (this->_pattern)._M_string_length, sVar2 != 0)) {
    pcVar1 = (this->_pattern)._M_dataplus._M_p;
    sVar4 = 0;
    do {
      iVar3 = toupper((int)pcVar1[sVar4]);
      pcVar1[sVar4] = (char)iVar3;
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return;
}

Assistant:

StringFilter(std::string const & pattern,
                     bool const & isExact = true,
                     bool const & isSensitive = true,
                     bool const & isAccept = true) :
                        _pattern(pattern),
                        _isExact(isExact),
                        _isSensitive(isSensitive),
                        _isAccept(isAccept)
        {
            if (!isSensitive)
            {
                std::transform(this->_pattern.begin(), this->_pattern.end(), this->_pattern.begin(), ::toupper);
            }
        }